

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pbkdf2_cmac.cpp
# Opt level: O2

void ot::commissioner::otPbkdf2Cmac
               (uint8_t *aPassword,uint16_t aPasswordLen,uint8_t *aSalt,uint16_t aSaltLen,
               uint32_t aIterationCounter,uint16_t aKeyLen,uint8_t *aKey)

{
  ushort uVar1;
  uint32_t j;
  ulong __n;
  long lVar2;
  undefined6 in_register_0000000a;
  int iVar3;
  uint32_t i;
  uint uVar4;
  ulong key_length;
  uint8_t *local_d0;
  long keyBlock [2];
  long prfOne [2];
  uint8_t prfInput [34];
  long prfTwo [2];
  
  __n = CONCAT62(in_register_0000000a,aSaltLen) & 0xffffffff;
  memcpy(prfInput,aSalt,__n);
  if ((aIterationCounter & 1) == 0) {
    local_d0 = aKey;
    key_length = (ulong)aPasswordLen;
    iVar3 = 0;
    for (; aKeyLen != 0; aKeyLen = aKeyLen - uVar1) {
      iVar3 = iVar3 + 1;
      prfInput[__n] = (uint8_t)((uint)iVar3 >> 0x18);
      prfInput[(ulong)aSaltLen + 1] = (uint8_t)((uint)iVar3 >> 0x10);
      prfInput[(ulong)aSaltLen + 2] = (uint8_t)((uint)iVar3 >> 8);
      prfInput[(ulong)aSaltLen + 3] = (uint8_t)iVar3;
      mbedtls_aes_cmac_prf_128
                (aPassword,key_length,prfInput,(ulong)(aSaltLen + 4),(uchar *)keyBlock);
      mbedtls_aes_cmac_prf_128(aPassword,key_length,(uchar *)keyBlock,0x10,(uchar *)prfOne);
      for (lVar2 = 0; lVar2 != 2; lVar2 = lVar2 + 1) {
        keyBlock[lVar2] = keyBlock[lVar2] ^ prfOne[lVar2];
      }
      for (uVar4 = 1; uVar4 < aIterationCounter >> 1; uVar4 = uVar4 + 1) {
        mbedtls_aes_cmac_prf_128(aPassword,key_length,(uchar *)prfOne,0x10,(uchar *)prfTwo);
        mbedtls_aes_cmac_prf_128(aPassword,key_length,(uchar *)prfTwo,0x10,(uchar *)prfOne);
        for (lVar2 = 0; lVar2 != 2; lVar2 = lVar2 + 1) {
          keyBlock[lVar2] = keyBlock[lVar2] ^ prfTwo[lVar2] ^ prfOne[lVar2];
        }
      }
      uVar1 = 0x10;
      if (aKeyLen < 0x10) {
        uVar1 = aKeyLen;
      }
      memcpy(local_d0,keyBlock,(ulong)uVar1);
      local_d0 = local_d0 + uVar1;
    }
    return;
  }
  __assert_fail("aIterationCounter % 2 == 0",
                "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/library/openthread/pbkdf2_cmac.cpp"
                ,0x44,
                "void ot::commissioner::otPbkdf2Cmac(const uint8_t *, uint16_t, const uint8_t *, uint16_t, uint32_t, uint16_t, uint8_t *)"
               );
}

Assistant:

void otPbkdf2Cmac(const uint8_t *aPassword,
                  uint16_t       aPasswordLen,
                  const uint8_t *aSalt,
                  uint16_t       aSaltLen,
                  uint32_t       aIterationCounter,
                  uint16_t       aKeyLen,
                  uint8_t       *aKey)
{
    const size_t kBlockSize = MBEDTLS_CIPHER_BLKSIZE_MAX;
    uint8_t      prfInput[OT_PBKDF2_SALT_MAX_LEN + 4]; // Salt || INT(), for U1 calculation
    long         prfOne[kBlockSize / sizeof(long)];
    long         prfTwo[kBlockSize / sizeof(long)];
    long         keyBlock[kBlockSize / sizeof(long)];
    uint32_t     blockCounter = 0;
    uint8_t     *key          = aKey;
    uint16_t     keyLen       = aKeyLen;
    uint16_t     useLen       = 0;

    memcpy(prfInput, aSalt, aSaltLen);
    assert(aIterationCounter % 2 == 0);
    aIterationCounter /= 2;

    while (keyLen)
    {
        ++blockCounter;
        prfInput[aSaltLen + 0] = static_cast<uint8_t>(blockCounter >> 24);
        prfInput[aSaltLen + 1] = static_cast<uint8_t>(blockCounter >> 16);
        prfInput[aSaltLen + 2] = static_cast<uint8_t>(blockCounter >> 8);
        prfInput[aSaltLen + 3] = static_cast<uint8_t>(blockCounter);

        // Calculate U_1
        mbedtls_aes_cmac_prf_128(aPassword, aPasswordLen, prfInput, aSaltLen + 4,
                                 reinterpret_cast<uint8_t *>(keyBlock));

        // Calculate U_2
        mbedtls_aes_cmac_prf_128(aPassword, aPasswordLen, reinterpret_cast<const uint8_t *>(keyBlock), kBlockSize,
                                 reinterpret_cast<uint8_t *>(prfOne));

        for (uint32_t j = 0; j < kBlockSize / sizeof(long); ++j)
        {
            keyBlock[j] ^= prfOne[j];
        }

        for (uint32_t i = 1; i < aIterationCounter; ++i)
        {
            // Calculate U_{2 * i - 1}
            mbedtls_aes_cmac_prf_128(aPassword, aPasswordLen, reinterpret_cast<const uint8_t *>(prfOne), kBlockSize,
                                     reinterpret_cast<uint8_t *>(prfTwo));
            // Calculate U_{2 * i}
            mbedtls_aes_cmac_prf_128(aPassword, aPasswordLen, reinterpret_cast<const uint8_t *>(prfTwo), kBlockSize,
                                     reinterpret_cast<uint8_t *>(prfOne));

            for (uint32_t j = 0; j < kBlockSize / sizeof(long); ++j)
            {
                keyBlock[j] ^= prfOne[j] ^ prfTwo[j];
            }
        }

        useLen = (keyLen < kBlockSize) ? keyLen : kBlockSize;
        memcpy(key, keyBlock, useLen);
        key += useLen;
        keyLen -= useLen;
    }
}